

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlrole.c
# Opt level: O3

int element3(PROLOG_STATE *state,int tok,char *ptr,char *end,ENCODING *enc)

{
  if (tok < 0x18) {
    if (tok == 0xf) {
      return 0x27;
    }
    if (tok == 0x15) {
      state->handler = element4;
      return 0x27;
    }
  }
  else {
    if (tok == 0x24) {
      state->handler = declClose;
      state->role_none = 0x27;
      return 0x2e;
    }
    if (tok == 0x18) {
      state->handler = declClose;
      state->role_none = 0x27;
      return 0x2d;
    }
  }
  state->handler = error;
  return -1;
}

Assistant:

static int PTRCALL
element3(PROLOG_STATE *state, int tok, const char *ptr, const char *end,
         const ENCODING *enc) {
  UNUSED_P(ptr);
  UNUSED_P(end);
  UNUSED_P(enc);
  switch (tok) {
  case XML_TOK_PROLOG_S:
    return XML_ROLE_ELEMENT_NONE;
  case XML_TOK_CLOSE_PAREN:
    state->handler = declClose;
    state->role_none = XML_ROLE_ELEMENT_NONE;
    return XML_ROLE_GROUP_CLOSE;
  case XML_TOK_CLOSE_PAREN_ASTERISK:
    state->handler = declClose;
    state->role_none = XML_ROLE_ELEMENT_NONE;
    return XML_ROLE_GROUP_CLOSE_REP;
  case XML_TOK_OR:
    state->handler = element4;
    return XML_ROLE_ELEMENT_NONE;
  }
  return common(state, tok);
}